

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O1

bool __thiscall
glcts::TessellationShaderBarrier3::verifyXFBBuffer(TessellationShaderBarrier3 *this,void *data)

{
  uint uVar1;
  ostream *poVar2;
  MessageBuilder *this_00;
  TestError *this_01;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  vector<int,_std::allocator<int>_> tcs_patch_result;
  vector<int,_std::allocator<int>_> tcs_data;
  stringstream logMessage;
  vector<int,_std::allocator<int>_> local_390;
  vector<int,_std::allocator<int>_> local_378;
  long *local_360;
  long local_350 [2];
  long *local_340;
  value_type_conflict1 local_338 [4];
  ostream local_328;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_338[0] = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_378,(ulong)this->m_n_invocations,local_338,(allocator_type *)local_1b0);
  local_338[0] = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_390,(ulong)this->m_n_invocations,local_338,(allocator_type *)local_1b0);
  if (this->m_n_invocations != 0) {
    uVar1 = 0;
    do {
      local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar1] = uVar1;
      uVar1 = uVar1 + 2;
    } while (uVar1 < this->m_n_invocations);
  }
  if (1 < this->m_n_invocations) {
    uVar1 = 1;
    do {
      local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar1] =
           local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar1 - 1] + uVar1;
      uVar1 = uVar1 + 2;
    } while (uVar1 < this->m_n_invocations);
  }
  uVar8 = (ulong)this->m_n_invocations;
  if (this->m_n_invocations != 0) {
    uVar5 = 0;
    do {
      local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar5] = 0;
      if ((uVar5 & 3) == 0) {
        iVar3 = local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] = iVar3;
        iVar3 = iVar3 + local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar5 + 1];
        local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] = iVar3;
        iVar3 = iVar3 + local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar5 + 2];
        local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] = iVar3;
        local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] =
             iVar3 + local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5 + 3];
      }
      uVar5 = uVar5 + 1;
      uVar8 = (ulong)this->m_n_invocations;
    } while (uVar5 < uVar8);
  }
  uVar1 = (uint)uVar8;
  if (uVar1 <= this->m_n_result_vertices) {
    uVar4 = 0;
    uVar5 = 0;
    do {
      lVar7 = 0;
      do {
        if (*(int *)((long)data + lVar7 * 4 + (ulong)uVar4 * 4) !=
            local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar7]) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_338);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&local_328,"Result data for patch [",0x17);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_328);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]: (",4);
          if (this->m_n_patch_vertices != 0) {
            uVar8 = 0;
            do {
              std::ostream::operator<<
                        (&local_328,*(int *)((long)data + uVar8 * 4 + (ulong)uVar4 * 4));
              bVar9 = uVar8 == this->m_n_patch_vertices - 1;
              pcVar6 = " , ";
              if (bVar9) {
                pcVar6 = " ), ";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_328,pcVar6 + 1,(ulong)bVar9 | 2);
              uVar8 = uVar8 + 1;
            } while (uVar8 < this->m_n_patch_vertices);
          }
          std::__ostream_insert<char,std::char_traits<char>>(&local_328,"expected: ",10);
          if (this->m_n_patch_vertices != 0) {
            uVar8 = 0;
            do {
              std::ostream::operator<<
                        (&local_328,
                         local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar8]);
              bVar9 = uVar8 == this->m_n_patch_vertices - 1;
              pcVar6 = ", ";
              if (bVar9) {
                pcVar6 = "). ";
              }
              std::__ostream_insert<char,std::char_traits<char>>(&local_328,pcVar6,(ulong)bVar9 | 2)
              ;
              uVar8 = uVar8 + 1;
            } while (uVar8 < this->m_n_patch_vertices);
          }
          local_1b0._0_8_ =
               ((this->super_TessellationShaderBarrierTestCase).super_TestCaseBase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__cxx11::stringbuf::str();
          local_340 = local_360;
          this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_340)
          ;
          tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if (local_360 != local_350) {
            operator_delete(local_360,local_350[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base(local_138);
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Invalid data captured",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                     ,0x3d8);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        lVar7 = lVar7 + 1;
      } while (uVar1 + (uVar8 == 0) != (int)lVar7);
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + uVar1 * 2;
    } while (uVar5 < this->m_n_result_vertices / uVar8);
  }
  if (local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool TessellationShaderBarrier3::verifyXFBBuffer(const void* data)
{
	const int*		 data_int = (const int*)data;
	std::vector<int> tcs_data(m_n_invocations, 0);
	std::vector<int> tcs_patch_result(m_n_invocations, 0);

	/* This is a simple C++ port of the TCS used for the test.
	 *
	 * Note: We only need to consider a single set of values stored by TES
	 *       for a single result point, as the same set of values will be
	 *       reported for the other point. Owing to the fact gl_InvocationID
	 *       in TCS will iterate from 0 to 15 for all input patches and instances,
	 *       we can re-use the data for all subsequent input patches. */
	/* Phase 1 */
	for (unsigned int n = 0; n < m_n_invocations; n += 2)
	{
		tcs_data[n] = n;
	}

	/* Phase 2 */
	for (unsigned int n = 1; n < m_n_invocations; n += 2)
	{
		tcs_data[n] = tcs_data[n - 1] + n;
	}

	/* Phase 3 */
	for (unsigned int n_patch_vertex = 0; n_patch_vertex < m_n_invocations; ++n_patch_vertex)
	{
		const unsigned int invocation_id = n_patch_vertex;

		tcs_patch_result[invocation_id] = 0;

		if ((invocation_id % 4) == 0)
		{
			tcs_patch_result[invocation_id] += tcs_data[invocation_id];
			tcs_patch_result[invocation_id] += tcs_data[invocation_id + 1];
			tcs_patch_result[invocation_id] += tcs_data[invocation_id + 2];
			tcs_patch_result[invocation_id] += tcs_data[invocation_id + 3];
		}
	} /* for (all patch vertices) */

	/* Time to do the actual comparison. */
	for (unsigned int n_patch = 0; n_patch < m_n_result_vertices / m_n_invocations; ++n_patch)
	{
		bool	   are_equal				 = true;
		const int  n_points_per_line_segment = 2;
		const int* patch_data_int			 = data_int + n_patch * m_n_invocations * n_points_per_line_segment;

		for (unsigned int n_invocation = 0; n_invocation < m_n_invocations; ++n_invocation)
		{
			if (patch_data_int[n_invocation] != tcs_patch_result[n_invocation])
			{
				are_equal = false;

				break;
			}
		} /* for (all patch vertices which have contributed for given input patch being considered) */

		if (!are_equal)
		{
			std::stringstream logMessage;

			logMessage << "Result data for patch [" << n_patch << "]: (";

			for (unsigned int n_patch_vertex = 0; n_patch_vertex < m_n_patch_vertices; ++n_patch_vertex)
			{
				logMessage << patch_data_int[n_patch_vertex];

				if (n_patch_vertex == (m_n_patch_vertices - 1))
				{
					logMessage << "), ";
				}
				else
				{
					logMessage << ", ";
				}
			} /* for (all patch vertices) */

			logMessage << "expected: ";

			for (unsigned int n_patch_vertex = 0; n_patch_vertex < m_n_patch_vertices; ++n_patch_vertex)
			{
				logMessage << tcs_patch_result[n_patch_vertex];

				if (n_patch_vertex == (m_n_patch_vertices - 1))
				{
					logMessage << "). ";
				}
				else
				{
					logMessage << ", ";
				}
			} /* for (all patch vertices) */

			/* Log the message */
			m_testCtx.getLog() << tcu::TestLog::Message << logMessage.str().c_str() << tcu::TestLog::EndMessage;

			/* Bail out */
			TCU_FAIL("Invalid data captured");
		} /* if (!are_equal) */
	}	 /* for (all patches) */

	return true;
}